

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void __thiscall AMusicChanger::PostBeginPlay(AMusicChanger *this)

{
  int local_14;
  int i;
  AMusicChanger *this_local;
  
  AActor::PostBeginPlay((AActor *)this);
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    if ((((playeringame[local_14] & 1U) != 0) && ((&players)[(long)local_14 * 0x54] != 0)) &&
       (*(sector_t **)((&players)[(long)local_14 * 0x54] + 0x130) ==
        (this->super_ASectorAction).super_AActor.Sector)) {
      ASectorAction::TriggerAction
                (&this->super_ASectorAction,(AActor *)(&players)[(long)local_14 * 0x54],1);
    }
  }
  return;
}

Assistant:

void AMusicChanger::PostBeginPlay()
{
	// The music changer should consider itself activated if the player
	// spawns in its sector as well as if it enters the sector during a P_TryMove.
	Super::PostBeginPlay();
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].mo && players[i].mo->Sector == this->Sector)
		{
			TriggerAction(players[i].mo, SECSPAC_Enter);
		}
	}
}